

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onBeforeInvoke(RACFGBuilder *this,InvokeNode *invokeNode)

{
  FuncValue *arg;
  undefined8 *puVar1;
  OperandPack *pOVar2;
  BaseBuilder *pBVar3;
  uint32_t uVar4;
  Error EVar5;
  uint uVar6;
  undefined8 extraout_RAX;
  char cVar7;
  uint uVar8;
  Operand_ *imm_;
  byte bVar9;
  long lVar10;
  InstId IVar11;
  InvokeNode *invokeNode_00;
  Environment EVar12;
  BaseEmitter *this_00;
  long lVar13;
  long lVar14;
  undefined1 *puVar15;
  bool bVar16;
  Reg dst;
  RAWorkReg *workReg;
  RAWorkReg *workReg_1;
  Operand_ local_78;
  InvokeNode *local_60;
  Operand_ local_58;
  RAWorkReg *local_40;
  undefined1 *local_38;
  
  local_38 = (undefined1 *)(ulong)(byte)invokeNode->field_0xf4;
  this_00 = *(BaseEmitter **)(this + 8);
  uVar4 = (this_00->_gpSignature)._bits;
  this_00[2]._funcs.emitArgsAssignment = *(EmitArgsAssignment *)invokeNode;
  if (local_38 != (undefined1 *)0x0) {
    bVar9 = (byte)uVar4 >> 3;
    puVar15 = &invokeNode->field_0x11c;
    lVar10 = 0;
    invokeNode_00 = (InvokeNode *)0x0;
    do {
      if (invokeNode_00 == (InvokeNode *)0x20) {
LAB_001479b8:
        onBeforeInvoke();
        goto LAB_001479bd;
      }
      lVar14 = 0;
      lVar13 = lVar10;
      local_60 = invokeNode_00;
      do {
        uVar6 = *(uint *)(puVar15 + lVar14);
        if (uVar6 == 0) break;
        if ((byte)invokeNode->field_0xf4 <= (byte)invokeNode_00) {
          onBeforeInvoke();
          return 0x1e;
        }
        pOVar2 = invokeNode->_args;
        uVar8 = *(uint *)((long)pOVar2->_data[0]._data + lVar14 * 4 + lVar10 + -8);
        if (uVar8 != 0) {
          arg = (FuncValue *)(puVar15 + lVar14);
          imm_ = (Operand_ *)((long)pOVar2->_data[0]._data + lVar13 + -8);
          uVar8 = uVar8 & 7;
          if (uVar8 == 4) {
            if ((uVar6 >> 8 & 1) == 0) {
              EVar5 = moveImmToStackArg(this,invokeNode_00,arg,(Imm *)imm_);
joined_r0x00147503:
              invokeNode_00 = local_60;
              if (EVar5 != 0) {
                return EVar5;
              }
            }
            else {
              local_78._signature._bits = 1;
              local_78._baseId = 0xff;
              local_78._data[0] = 0;
              local_78._data[1] = 0;
              EVar5 = moveImmToRegArg(this,invokeNode_00,arg,(Imm *)imm_,(BaseReg *)&local_78);
              if (EVar5 != 0) {
                return EVar5;
              }
              puVar1 = (undefined8 *)
                       ((long)invokeNode->_args->_data[0]._data + lVar14 * 4 + lVar10 + -8);
              *puVar1 = CONCAT44(local_78._baseId,local_78._signature._bits);
              puVar1[1] = CONCAT44(local_78._data[1],local_78._data[0]);
              invokeNode_00 = local_60;
            }
          }
          else if (uVar8 == 1) {
            uVar8 = *(int *)((long)pOVar2->_data[0]._data + lVar14 * 4 + lVar10 + -4) - 0x100;
            pBVar3 = ((*(BaseRAPass **)this)->super_FuncPass).super_Pass._cb;
            if (*(uint *)&pBVar3[1].super_BaseEmitter._logger <= uVar8) {
              return 0x1e;
            }
            EVar12 = (&(pBVar3[1].super_BaseEmitter._code)->_environment)[uVar8];
            local_58._0_8_ = *(undefined8 *)((long)EVar12 + 0x28);
            if (local_58._0_8_ == 0) {
              EVar5 = BaseRAPass::_asWorkReg
                                (*(BaseRAPass **)this,(VirtReg *)EVar12,(RAWorkReg **)&local_58);
              if (EVar5 != 0) {
                return EVar5;
              }
              uVar6 = arg->_data;
            }
            if ((uVar6 >> 8 & 1) == 0) {
              if ((uVar6 >> 10 & 1) != 0) {
                uVar6 = *(uint *)((long)pOVar2->_data[0]._data + lVar14 * 4 + lVar10 + -8);
                if ((uVar6 & 0xf00) == 0) {
                  if (bVar9 != (byte)(uVar6 >> 3)) {
                    return 0x19;
                  }
                  EVar5 = moveRegToStackArg(this,(InvokeNode *)EVar12,arg,(BaseReg *)imm_);
                  invokeNode_00 = local_60;
                  if (EVar5 != 0) {
                    return EVar5;
                  }
                  goto LAB_00147696;
                }
                local_78._signature._bits = 1;
                local_78._baseId = 0xff;
                local_78._data[0] = 0;
                local_78._data[1] = 0;
                EVar12 = (Environment)invokeNode;
                moveVecToPtr(this,invokeNode,arg,(Vec *)imm_,(BaseReg *)&local_78);
                imm_ = &local_78;
              }
              EVar5 = moveRegToStackArg(this,(InvokeNode *)EVar12,arg,(BaseReg *)imm_);
              goto joined_r0x00147503;
            }
            if (0x1fffffff < uVar6) {
              onBeforeInvoke();
              goto LAB_001479b8;
            }
            if ((uVar6 >> 10 & 1) == 0) {
              bVar16 = ((*(uint *)(local_58._0_8_ + 0x20) ^
                        *(uint *)(_archTraits + (ulong)(uVar6 >> 0x18) * 4 + 0xec)) & 0xf00) == 0;
            }
            else {
              uVar6 = *(uint *)((long)pOVar2->_data[0]._data + lVar14 * 4 + lVar10 + -8);
              if ((uVar6 & 0xf00) != 0) {
                local_78._signature._bits = 1;
                local_78._baseId = 0xff;
                local_78._data[0] = 0;
                local_78._data[1] = 0;
                moveVecToPtr(this,invokeNode,arg,(Vec *)imm_,(BaseReg *)&local_78);
                puVar1 = (undefined8 *)
                         ((long)invokeNode->_args->_data[0]._data + lVar14 * 4 + lVar10 + -8);
                *puVar1 = CONCAT44(local_78._baseId,local_78._signature._bits);
                puVar1[1] = CONCAT44(local_78._data[1],local_78._data[0]);
                invokeNode_00 = local_60;
                goto LAB_00147696;
              }
              bVar16 = bVar9 == (byte)(uVar6 >> 3);
            }
            invokeNode_00 = local_60;
            if (!bVar16) {
              return 0x19;
            }
          }
        }
LAB_00147696:
        lVar14 = lVar14 + 4;
        lVar13 = lVar13 + 0x10;
      } while (lVar14 != 0x10);
      invokeNode_00 = (InvokeNode *)&invokeNode_00->field_0x1;
      puVar15 = puVar15 + 0x10;
      lVar10 = lVar10 + 0x40;
    } while (invokeNode_00 != (InvokeNode *)local_38);
    this_00 = *(BaseEmitter **)(this + 8);
  }
  this_00[2]._funcs.emitArgsAssignment = (EmitArgsAssignment)invokeNode;
  if (((invokeNode->field_0x88 & 1) != 0) && (*(uint *)&invokeNode->field_0x108 != 0)) {
    local_78._signature._bits = (this_00->_gpSignature)._bits;
    local_78._baseId = 4;
    local_78._data[0] = 0;
    local_78._data[1] = 0;
    local_58._signature._bits = 4;
    local_58._baseId = 0;
    local_58._data[1] = 0;
    local_58._data[0] = *(uint *)&invokeNode->field_0x108;
    EVar5 = BaseEmitter::_emitI(this_00,0x311,&local_78,&local_58);
    if (EVar5 != 0) {
      return EVar5;
    }
  }
  if (*(int *)&invokeNode->field_0x10c != 0) {
    lVar10 = 199;
    do {
      uVar6 = *(uint *)(&invokeNode->field_0x45 + lVar10);
      if (uVar6 == 0) break;
      if ((*(uint *)(&invokeNode->super_InstNodeWithOperands<4U> + lVar10 * 4) & 7) == 1) {
        uVar8 = *(int *)(&invokeNode->field_0x4 + lVar10 * 4) - 0x100;
        pBVar3 = ((*(BaseRAPass **)this)->super_FuncPass).super_Pass._cb;
        if (*(uint *)&pBVar3[1].super_BaseEmitter._logger <= uVar8) {
          return 0x1e;
        }
        EVar12 = (&(pBVar3[1].super_BaseEmitter._code)->_environment)[uVar8];
        local_40 = *(RAWorkReg **)((long)EVar12 + 0x28);
        if (local_40 == (RAWorkReg *)0x0) {
          EVar5 = BaseRAPass::_asWorkReg(*(BaseRAPass **)this,(VirtReg *)EVar12,&local_40);
          if (EVar5 != 0) {
            return EVar5;
          }
          uVar6 = *(uint *)(&invokeNode->field_0x45 + lVar10);
        }
        if ((uVar6 >> 8 & 1) != 0) {
          if (uVar6 >> 0x18 == 0x16) {
            local_78._signature._bits = *(uint32_t *)(local_40 + 0x20);
            if ((local_78._signature._bits & 0xf00) != 0x100) {
              return 0x19;
            }
            local_78._baseId = *(uint32_t *)(local_40 + 4);
            local_78._data[0] = 0;
            local_78._data[1] = 0;
            local_58._signature._bits = 2;
            local_58._baseId = 0;
            local_58._data[0] = 0;
            local_58._data[1] = 0;
            cVar7 = TypeUtils::_typeData[*(byte *)(*(long *)(local_40 + 8) + 0xd)];
            if ((char)uVar6 != '\0') {
              cVar7 = (char)uVar6;
            }
            if (cVar7 == '+') {
              EVar5 = BaseRAPass::useTemporaryMem(*(BaseRAPass **)this,(BaseMem *)&local_58,8,4);
              if (EVar5 != 0) {
                return EVar5;
              }
              local_58._signature._bits._3_1_ = 8;
              EVar5 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),0x103,&local_58);
              if (EVar5 != 0) {
                return EVar5;
              }
              IVar11 = 0x1d6;
              if (this[0x292] != (RACFGBuilder)0x0) {
                IVar11 = 0x4c1;
              }
              EVar5 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),IVar11,&local_78,&local_58);
            }
            else {
              if (cVar7 != '*') {
                return 0x19;
              }
              EVar5 = BaseRAPass::useTemporaryMem(*(BaseRAPass **)this,(BaseMem *)&local_58,4,4);
              if (EVar5 != 0) {
                return EVar5;
              }
              local_58._signature._bits._3_1_ = 4;
              EVar5 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),0x103,&local_58);
              if (EVar5 != 0) {
                return EVar5;
              }
              IVar11 = 0x1d9;
              if (this[0x292] != (RACFGBuilder)0x0) {
                IVar11 = 0x4c5;
              }
              EVar5 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),IVar11,&local_78,&local_58);
            }
            if (EVar5 != 0) {
              return EVar5;
            }
          }
          else {
            if (0x1fffffff < uVar6) {
LAB_001479bd:
              onBeforeInvoke();
              __clang_call_terminate(extraout_RAX);
            }
            if (((*(uint *)(_archTraits + (ulong)(uVar6 >> 0x18) * 4 + 0xec) ^
                 *(uint *)(local_40 + 0x20)) & 0xf00) != 0) {
              return 0x19;
            }
          }
        }
      }
      lVar10 = lVar10 + 4;
    } while (lVar10 != 0xd7);
  }
  *(uint *)(*(long *)(this + 0x10) + 0xc) = *(uint *)(*(long *)(this + 0x10) + 0xc) | 0x1000;
  lVar10 = *(long *)(*(long *)this + 0x98);
  *(uint *)(lVar10 + 0x2d0) = *(uint *)(lVar10 + 0x2d0) | 0x20;
  uVar6 = *(uint *)&invokeNode->field_0x108;
  if (*(uint *)&invokeNode->field_0x108 < *(uint *)(lVar10 + 0x2e0)) {
    uVar6 = *(uint *)(lVar10 + 0x2e0);
  }
  *(uint *)(lVar10 + 0x2e0) = uVar6;
  return 0;
}

Assistant:

Error RACFGBuilder::onBeforeInvoke(InvokeNode* invokeNode) noexcept {
  const FuncDetail& fd = invokeNode->detail();
  uint32_t argCount = invokeNode->argCount();

  cc()->_setCursor(invokeNode->prev());
  RegType nativeRegType = cc()->_gpSignature.regType();

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    const FuncValuePack& argPack = fd.argPack(argIndex);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      if (!argPack[valueIndex])
        break;

      const FuncValue& arg = argPack[valueIndex];
      const Operand& op = invokeNode->arg(argIndex, valueIndex);

      if (op.isNone())
        continue;

      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (arg.isReg()) {
          RegGroup regGroup = workReg->group();
          RegGroup argGroup = Reg::groupOf(arg.regType());

          if (arg.isIndirect()) {
            if (reg.isGp()) {
              if (reg.type() != nativeRegType)
                return DebugUtils::errored(kErrorInvalidAssignment);
              // It's considered allocated if this is an indirect argument and the user used GP.
              continue;
            }

            BaseReg indirectReg;
            moveVecToPtr(invokeNode, arg, reg.as<Vec>(), &indirectReg);
            invokeNode->_args[argIndex][valueIndex] = indirectReg;
          }
          else {
            if (regGroup != argGroup) {
              // TODO: Conversion is not supported.
              return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
        }
        else {
          if (arg.isIndirect()) {
            if (reg.isGp()) {
              if (reg.type() != nativeRegType)
                return DebugUtils::errored(kErrorInvalidAssignment);

              ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, reg));
              continue;
            }

            BaseReg indirectReg;
            moveVecToPtr(invokeNode, arg, reg.as<Vec>(), &indirectReg);
            ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, indirectReg));
          }
          else {
            ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, reg));
          }
        }
      }
      else if (op.isImm()) {
        if (arg.isReg()) {
          BaseReg reg;
          ASMJIT_PROPAGATE(moveImmToRegArg(invokeNode, arg, op.as<Imm>(), &reg));
          invokeNode->_args[argIndex][valueIndex] = reg;
        }
        else {
          ASMJIT_PROPAGATE(moveImmToStackArg(invokeNode, arg, op.as<Imm>()));
        }
      }
    }
  }

  cc()->_setCursor(invokeNode);
  if (fd.hasFlag(CallConvFlags::kCalleePopsStack) && fd.argStackSize() != 0)
    ASMJIT_PROPAGATE(cc()->sub(cc()->zsp(), fd.argStackSize()));

  if (fd.hasRet()) {
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      const FuncValue& ret = fd.ret(valueIndex);
      if (!ret)
        break;

      const Operand& op = invokeNode->ret(valueIndex);
      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (ret.isReg()) {
          if (ret.regType() == RegType::kX86_St) {
            if (workReg->group() != RegGroup::kVec)
              return DebugUtils::errored(kErrorInvalidAssignment);

            Reg dst(workReg->signature(), workReg->virtId());
            Mem mem;

            TypeId typeId = TypeUtils::scalarOf(workReg->typeId());
            if (ret.hasTypeId())
              typeId = ret.typeId();

            switch (typeId) {
              case TypeId::kFloat32:
                ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 4, 4));
                mem.setSize(4);
                ASMJIT_PROPAGATE(cc()->fstp(mem));
                ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovss, Inst::kIdVmovss), dst.as<Xmm>(), mem));
                break;

              case TypeId::kFloat64:
                ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 8, 4));
                mem.setSize(8);
                ASMJIT_PROPAGATE(cc()->fstp(mem));
                ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovsd, Inst::kIdVmovsd), dst.as<Xmm>(), mem));
                break;

              default:
                return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
          else {
            RegGroup regGroup = workReg->group();
            RegGroup retGroup = Reg::groupOf(ret.regType());

            if (regGroup != retGroup) {
              // TODO: Conversion is not supported.
              return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
        }
      }
    }
  }

  // This block has function call(s).
  _curBlock->addFlags(RABlockFlags::kHasFuncCalls);
  _pass->func()->frame().addAttributes(FuncAttributes::kHasFuncCalls);
  _pass->func()->frame().updateCallStackSize(fd.argStackSize());

  return kErrorOk;
}